

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

bool RPCIsInWarmup(string *outStatus)

{
  byte bVar1;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock8;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = (mutex_type *)&g_rpc_warmup_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  if (outStatus != (string *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (outStatus,&rpcWarmupStatus_abi_cxx11_);
  }
  bVar1 = fRPCInWarmup;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)((bVar1 ^ 1) & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool RPCIsInWarmup(std::string *outStatus)
{
    LOCK(g_rpc_warmup_mutex);
    if (outStatus)
        *outStatus = rpcWarmupStatus;
    return fRPCInWarmup;
}